

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O1

size_t __thiscall caffe::ConcatParameter::ByteSizeLong(ConcatParameter *this)

{
  void *pvVar1;
  int iVar2;
  size_t sVar3;
  uint uVar4;
  ulong uVar5;
  uint uVar6;
  
  pvVar1 = (this->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)pvVar1 & 1) == 0) {
    sVar3 = 0;
  }
  else {
    sVar3 = google::protobuf::internal::WireFormat::ComputeUnknownFieldsSize
                      ((UnknownFieldSet *)((ulong)pvVar1 & 0xfffffffffffffffe));
  }
  uVar4 = (this->_has_bits_).has_bits_[0];
  if ((uVar4 & 3) != 0) {
    if ((uVar4 & 1) != 0) {
      uVar6 = this->concat_dim_ | 1;
      iVar2 = 0x1f;
      if (uVar6 != 0) {
        for (; uVar6 >> iVar2 == 0; iVar2 = iVar2 + -1) {
        }
      }
      sVar3 = sVar3 + (iVar2 * 9 + 0x49U >> 6) + 1;
    }
    if ((uVar4 & 2) != 0) {
      if (this->axis_ < 0) {
        uVar5 = 0xb;
      }
      else {
        uVar4 = this->axis_ | 1;
        iVar2 = 0x1f;
        if (uVar4 != 0) {
          for (; uVar4 >> iVar2 == 0; iVar2 = iVar2 + -1) {
          }
        }
        uVar5 = (ulong)((iVar2 * 9 + 0x49U >> 6) + 1);
      }
      sVar3 = sVar3 + uVar5;
    }
  }
  this->_cached_size_ = (int)sVar3;
  return sVar3;
}

Assistant:

size_t ConcatParameter::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:caffe.ConcatParameter)
  size_t total_size = 0;

  if (_internal_metadata_.have_unknown_fields()) {
    total_size +=
      ::google::protobuf::internal::WireFormat::ComputeUnknownFieldsSize(
        unknown_fields());
  }
  if (_has_bits_[0 / 32] & 3u) {
    // optional uint32 concat_dim = 1 [default = 1];
    if (has_concat_dim()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::UInt32Size(
          this->concat_dim());
    }

    // optional int32 axis = 2 [default = 1];
    if (has_axis()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::Int32Size(
          this->axis());
    }

  }
  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}